

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

void cleanup_p_race(void)

{
  player_race *ppVar1;
  player_race *p;
  
  p = races;
  while (p != (player_race *)0x0) {
    ppVar1 = p->next;
    string_free(p->name);
    mem_free(p);
    p = ppVar1;
  }
  return;
}

Assistant:

static void cleanup_p_race(void)
{
	struct player_race *p = races;
	struct player_race *next;

	while (p) {
		next = p->next;
		string_free((char *)p->name);
		mem_free(p);
		p = next;
	}
}